

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

void __thiscall DataServer::readFileAndOutput(DataServer *this)

{
  char cVar1;
  void *pvVar2;
  ostream *poVar3;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string blockpath;
  string local_230;
  ifstream blcokFile;
  
  std::__cxx11::to_string(&local_230,this->serverId);
  std::operator+(&local_2b0,"dfsfiles/datanode",&local_230);
  std::operator+(&local_290,&local_2b0,"/");
  std::operator+(&local_270,&local_290,&read_logic_file_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blcokFile,
                 &local_270,"-part");
  std::__cxx11::to_string(&local_2d0,read_block);
  std::operator+(&blockpath,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blcokFile,
                 &local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&blcokFile);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_230);
  std::ifstream::ifstream(&blcokFile,(string *)&blockpath,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open block");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    pvVar2 = operator_new__(0x200000);
    std::istream::seekg((long)&blcokFile,offset_in_block);
    std::istream::read((char *)&blcokFile,(long)pvVar2);
    std::ostream::write((char *)&std::cout,(long)pvVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    operator_delete__(pvVar2);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&blcokFile);
  std::__cxx11::string::~string((string *)&blockpath);
  return;
}

Assistant:

void readFileAndOutput() const
    {
        string blockpath = "dfsfiles/datanode" + to_string(serverId) + "/"
        + read_logic_file + "-part" + to_string(read_block);

        ifstream blcokFile(blockpath);

        if (blcokFile.is_open())
        {
            char *buffer = new char[block_size_int];
            blcokFile.seekg(offset_in_block, blcokFile.beg);
            blcokFile.read(buffer, read_count);

            cout.write(buffer, read_count);
            cout << endl;

            delete[] buffer;
            blcokFile.close();
        }
        else
        {
            cerr << "Failed to open block" << endl;
        }
    }